

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmPageTableMgr.cpp
# Opt level: O0

GMM_PAGETABLEPool * __thiscall
GmmLib::GmmPageTableMgr::__GetFreePoolNode
          (GmmPageTableMgr *this,uint32_t *FreePoolNodeIdx,POOL_TYPE PoolType)

{
  bool bVar1;
  int iVar2;
  GMM_LIB_CONTEXT *pGVar3;
  WA_TABLE *pWVar4;
  int *piVar5;
  POOL_TYPE *pPVar6;
  uint32_t *puVar7;
  GmmPageTablePool **ppGVar8;
  GMM_PAGETABLEPool *pGVar9;
  bool bVar10;
  int local_98;
  int local_90;
  int local_8c;
  int local_88;
  ulong local_80;
  ulong local_78;
  bool local_69;
  GmmPageTablePool *local_68;
  GmmPageTablePool *local_60;
  GMM_PAGETABLEPool *Pool_1;
  GMM_PAGETABLEPool *Pool;
  bool TRTTPool;
  bool PoolNodeFound;
  uint32_t IdxMultiplier;
  uint32_t DWdivisor;
  uint32_t j;
  uint32_t i;
  uint32_t PoolNode;
  POOL_TYPE PoolType_local;
  uint32_t *FreePoolNodeIdx_local;
  GmmPageTableMgr *this_local;
  
  j = 0xffffffff;
  IdxMultiplier = 0;
  bVar1 = false;
  i = PoolType;
  _PoolNode = FreePoolNodeIdx;
  FreePoolNodeIdx_local = (uint32_t *)this;
  if (this->AuxTTObj != (AuxTable *)0x0) {
    EnterCriticalSection(&this->PoolLock);
  }
  local_60 = this->pPool;
  if (i != 1) {
    if (local_60 == (GmmPageTablePool *)0x0) {
      local_68 = (GmmPageTablePool *)0x0;
    }
    else {
      ppGVar8 = GmmPageTablePool::GetNextPool(local_60);
      local_68 = *ppGVar8;
    }
    local_60 = local_68;
  }
  Pool_1 = local_60;
  local_69 = 1 < i;
  if (local_69) {
    if (i == 3) {
      local_80 = 0x100;
    }
    else {
      pGVar3 = GetLibContext(this);
      if (pGVar3 == (GMM_LIB_CONTEXT *)0x0) {
        local_88 = 2;
      }
      else {
        pGVar3 = GetLibContext(this);
        pWVar4 = Context::GetWaTable(pGVar3);
        bVar10 = true;
        if (((uint)((ulong)*(undefined8 *)&pWVar4->field_0x4 >> 0x2f) & 1) == 0) {
          pGVar3 = GetLibContext(this);
          pWVar4 = Context::GetWaTable(pGVar3);
          bVar10 = (*(ulong *)&pWVar4->field_0x4 >> 0x2e & 1) != 0;
        }
        local_88 = 1;
        if (bVar10) {
          local_88 = 2;
        }
      }
      local_80 = (long)local_88 << 5;
    }
    local_78 = local_80;
  }
  else {
    local_78 = 0x20;
  }
  if (local_69) {
    if (i == 3) {
      local_90 = 8;
    }
    else {
      pGVar3 = GetLibContext(this);
      if (pGVar3 == (GMM_LIB_CONTEXT *)0x0) {
        local_98 = 2;
      }
      else {
        pGVar3 = GetLibContext(this);
        pWVar4 = Context::GetWaTable(pGVar3);
        bVar10 = true;
        if (((uint)((ulong)*(undefined8 *)&pWVar4->field_0x4 >> 0x2f) & 1) == 0) {
          pGVar3 = GetLibContext(this);
          pWVar4 = Context::GetWaTable(pGVar3);
          bVar10 = (*(ulong *)&pWVar4->field_0x4 >> 0x2e & 1) != 0;
        }
        local_98 = 1;
        if (bVar10) {
          local_98 = 2;
        }
      }
      local_90 = local_98;
    }
    local_8c = local_90;
  }
  else {
    local_8c = 1;
  }
  DWdivisor = (uint32_t)(i != 1);
  do {
    bVar10 = false;
    if (Pool_1 != (GMM_PAGETABLEPool *)0x0) {
      bVar10 = DWdivisor < this->NumNodePoolElements;
    }
    if (!bVar10) {
      if ((!bVar1) &&
         (pGVar9 = __AllocateNodePool(this,local_8c << 0xc,i), pGVar9 != (GMM_PAGETABLEPool *)0x0))
      {
        *_PoolNode = 0;
        if (this->AuxTTObj == (AuxTable *)0x0) {
          return pGVar9;
        }
        LeaveCriticalSection(&this->PoolLock);
        return pGVar9;
      }
      if (this->AuxTTObj != (AuxTable *)0x0) {
        LeaveCriticalSection(&this->PoolLock);
      }
      return (GMM_PAGETABLEPool *)0x0;
    }
    piVar5 = GmmPageTablePool::GetNumFreeNode(Pool_1);
    if ((0 < *piVar5) && (pPVar6 = GmmPageTablePool::GetPoolType(Pool_1), *pPVar6 == i)) {
      bVar1 = true;
      *_PoolNode = 0;
      for (; IdxMultiplier < (uint)(0x200 / local_78); IdxMultiplier = IdxMultiplier + 1) {
        puVar7 = GmmPageTablePool::GetNodeUsageAtIndex(Pool_1,IdxMultiplier);
        iVar2 = _BitScanForward(&j,*puVar7 ^ 0xffffffff);
        if (iVar2 != 0) {
          *_PoolNode = j * local_8c + *_PoolNode;
          bVar1 = true;
          break;
        }
        bVar1 = false;
        *_PoolNode = (int)local_78 + *_PoolNode;
      }
    }
    if (bVar1) {
      if (this->AuxTTObj != (AuxTable *)0x0) {
        LeaveCriticalSection(&this->PoolLock);
      }
      return Pool_1;
    }
    ppGVar8 = GmmPageTablePool::GetNextPool(Pool_1);
    Pool_1 = *ppGVar8;
    DWdivisor = DWdivisor + 1;
  } while( true );
}

Assistant:

GmmLib::GMM_PAGETABLEPool *GmmLib::GmmPageTableMgr::__GetFreePoolNode(uint32_t *FreePoolNodeIdx, POOL_TYPE PoolType)
{
    uint32_t PoolNode = -1, i = 0, j = 0, DWdivisor = 1, IdxMultiplier = 1;
    bool     PoolNodeFound = false, TRTTPool = false;

    ENTER_CRITICAL_SECTION
    GmmLib::GMM_PAGETABLEPool *Pool = pPool;

    Pool = (PoolType == POOL_TYPE_TRTTL2) ? Pool : //1st pool reserved for TRTT-L2, since TRTT-L2 pruning not supported yet,
           (Pool ? Pool->GetNextPool() : NULL);    //other pools can be TR-L1/Aux-L1/Aux-L2 (and support dynamic pruning)
    TRTTPool      = (PoolType == POOL_TYPE_TRTTL2 || PoolType == POOL_TYPE_TRTTL1) ? true : false;
    DWdivisor     = TRTTPool ? 8 * sizeof(uint32_t) : (PoolType == POOL_TYPE_AUXTTL2) ? 8 * sizeof(uint32_t) * AUX_L2TABLE_SIZE_IN_POOLNODES : 8 * sizeof(uint32_t) * AUX_L1TABLE_SIZE_IN_POOLNODES_2(GetLibContext());
    IdxMultiplier = TRTTPool ? 1 : (PoolType == POOL_TYPE_AUXTTL2) ? AUX_L2TABLE_SIZE_IN_POOLNODES : AUX_L1TABLE_SIZE_IN_POOLNODES_2(GetLibContext());
    //Scan existing PageTablePools for free pool node
    for(i = (PoolType == POOL_TYPE_TRTTL2) ? 0 : 1; Pool && i < NumNodePoolElements; i++)
    {
        if(Pool->GetNumFreeNode() > 0 && Pool->GetPoolType() == PoolType)
        {
            PoolNodeFound    = true;
            *FreePoolNodeIdx = 0;
            for(; j < PAGETABLE_POOL_MAX_NODES / DWdivisor; j++)
            {
                if(_BitScanForward((uint32_t *)&PoolNode, (uint32_t) ~(Pool->GetNodeUsageAtIndex(j)))) // Get LSB that has value 0
                {
                    *FreePoolNodeIdx += PoolNode * IdxMultiplier;
                    PoolNodeFound = true;
                    break;
                }
                PoolNodeFound = false;
                *FreePoolNodeIdx += DWdivisor; //DWORD size in bits
            }
        }
        if(PoolNodeFound)
        {
            __GMM_ASSERT(Pool->GetPoolType() == PoolType);
            EXIT_CRITICAL_SECTION
            return Pool;
        }
        Pool = Pool->GetNextPool();
    }

    //No free pool node, allocate new
    if(!PoolNodeFound)
    {
        GMM_PAGETABLEPool *Pool = NULL;
        if(Pool = __AllocateNodePool(IdxMultiplier * PAGE_SIZE, PoolType))
        {
            __GMM_ASSERT(Pool->GetPoolType() == PoolType);

            *FreePoolNodeIdx = 0;
            EXIT_CRITICAL_SECTION
            return Pool;
        }
    }

    EXIT_CRITICAL_SECTION
    return NULL;
}